

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildRender8bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uchar in_marker_pixel_value)

{
  uchar *puVar1;
  uchar uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((x < 0) || (atlas->TexWidth < w + x)) {
    __assert_fail("x >= 0 && x + w <= atlas->TexWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa61,
                  "void ImFontAtlasBuildRender8bppRectFromString(ImFontAtlas *, int, int, int, int, const char *, char, unsigned char)"
                 );
  }
  if ((-1 < y) && (h + y <= atlas->TexHeight)) {
    if (0 < h) {
      puVar1 = atlas->TexPixelsAlpha8 + (long)(atlas->TexWidth * y) + (ulong)(uint)x;
      iVar3 = 0;
      do {
        if (0 < w) {
          uVar4 = 0;
          do {
            uVar2 = in_marker_pixel_value;
            if (in_str[uVar4] != in_marker_char) {
              uVar2 = '\0';
            }
            puVar1[uVar4] = uVar2;
            uVar4 = uVar4 + 1;
          } while ((uint)w != uVar4);
        }
        iVar3 = iVar3 + 1;
        puVar1 = puVar1 + atlas->TexWidth;
        in_str = in_str + w;
      } while (iVar3 != h);
    }
    return;
  }
  __assert_fail("y >= 0 && y + h <= atlas->TexHeight",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                ,0xa62,
                "void ImFontAtlasBuildRender8bppRectFromString(ImFontAtlas *, int, int, int, int, const char *, char, unsigned char)"
               );
}

Assistant:

void ImFontAtlasBuildRender8bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned char in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned char* out_pixel = atlas->TexPixelsAlpha8 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : 0x00;
}